

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O2

bool TestPowerAmplifier(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  uint uVar1;
  uint index;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ostream *poVar8;
  int iVar9;
  uint index_00;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool local_119;
  uint local_118;
  uint local_114;
  unsigned_long cur [4];
  char buf [100];
  
  iVar9 = 0;
  AmpIO::WriteWatchdogPeriod(Board,0);
  uVar6 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  poVar8 = std::endl<char,std::char_traits<char>>((ostream *)logFile);
  poVar8 = std::operator<<(poVar8,"=== Power Amplifier Test ===");
  std::endl<char,std::char_traits<char>>(poVar8);
  Amp1394Console::Print(curLine,9,"Temperature sensors - ");
  Amp1394Console::Refresh();
  AmpIO::WritePowerEnable(Board,true);
  uVar1 = (uint)(qlaNum == 2) * 4;
  if (uVar6 < 8) {
    AmpIO::WriteAmpEnable(Board,0xf,0xf);
  }
  else {
    for (; iVar9 != 4; iVar9 = iVar9 + 1) {
      AmpIO::WriteAmpEnableAxis(Board,uVar1 + iVar9,true);
    }
  }
  for (iVar9 = 0; iVar9 != 4; iVar9 = iVar9 + 1) {
    AmpIO::SetMotorCurrent(Board,uVar1 + iVar9,0x8000);
  }
  (*Port->_vptr_BasePort[0x21])(Port);
  Amp1394_Sleep(1.0);
  (*Port->_vptr_BasePort[0x1d])(Port);
  if (uVar6 < 8) {
    uVar7 = AmpIO::GetStatus(Board);
    if ((~uVar7 & 0xc0f0f) == 0) goto LAB_001079b3;
    sprintf(buf,"Failed to enable power (%08lx) - is motor power connected?",(ulong)uVar7);
  }
  else {
    iVar9 = 0;
    do {
      if (iVar9 == 4) goto LAB_001079b3;
      bVar16 = AmpIO::GetAmpEnable(Board,uVar1 + iVar9);
      iVar9 = iVar9 + 1;
    } while (bVar16);
    builtin_strncpy(buf,"Failed to enable power - is motor power connected?",0x33);
  }
  Amp1394Console::Print(curLine,9,buf);
  curLine = curLine + 1;
LAB_001079b3:
  Amp1394Console::Print(curLine,9,"Temperature sensors - ");
  index = (uint)(qlaNum == 2) * 2;
  bVar2 = AmpIO::GetAmpTemperature(Board,index);
  bVar3 = bVar2 >> 1;
  index_00 = (uint)(qlaNum == 2) * 2 + 1;
  bVar4 = AmpIO::GetAmpTemperature(Board,index_00);
  bVar5 = bVar4 >> 1;
  poVar8 = std::operator<<((ostream *)logFile,"   Motor temperatures: ");
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ushort)bVar3);
  poVar8 = std::operator<<(poVar8,", ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ushort)bVar5);
  std::operator<<(poVar8," degC (expected range is 20-40) ");
  bVar16 = (byte)(bVar2 + 0xae) < 0xd6;
  bVar17 = (byte)(bVar4 + 0xae) < 0xd6;
  pcVar10 = "- PASS";
  if (bVar17 || bVar16) {
    pcVar10 = "- FAIL";
  }
  pcVar13 = "PASS (%d, %d degC)";
  if (bVar17 || bVar16) {
    pcVar13 = "FAIL (%d, %d degC)";
  }
  poVar8 = std::operator<<((ostream *)logFile,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar8);
  sprintf(buf,pcVar13,(ulong)(uint)bVar3,(ulong)(uint)bVar5);
  Amp1394Console::Print(curLine,0x1f,buf);
  Amp1394Console::Print(curLine + 1,9,"DAC:");
  Amp1394Console::Print(curLine + 2,9,"ADC:");
  Amp1394Console::Print(curLine + 4,9,"Temp:");
  Amp1394Console::Refresh();
  uVar14 = 0x8000;
  local_119 = true;
  local_118 = (uint)bVar5;
  local_114 = (uint)bVar3;
  while( true ) {
    sprintf(buf,"%04lx   %04lx   %04lx   %04lx",uVar14,uVar14,uVar14,uVar14);
    iVar9 = 0xf;
    Amp1394Console::Print(curLine + 1,0xf,buf);
    poVar8 = std::operator<<((ostream *)logFile,"   Commanded current: ");
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,", Measured currents: ");
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      bVar18 = uVar14 == 0;
      uVar7 = AmpIO::GetMotorCurrent(Board,uVar1 | (uint)lVar12);
      uVar15 = (ulong)uVar7;
      cur[lVar12] = uVar15;
      *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
           *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      bVar17 = uVar15 <= (uVar14 | 0x100);
      bVar16 = uVar14 - 0x100 <= uVar15;
      pcVar10 = "* ";
      if ((bVar16 || bVar18) && bVar17) {
        pcVar10 = "  ";
      }
      pcVar13 = "FAIL";
      if ((bVar16 || bVar18) && bVar17) {
        pcVar13 = "PASS";
      }
      local_119 = (bool)(local_119 & ((bVar16 || bVar18) && bVar17));
      std::operator<<((ostream *)logFile,pcVar10);
      Amp1394Console::Print(curLine + 3,iVar9,pcVar13);
      iVar9 = iVar9 + 7;
    }
    std::endl<char,std::char_traits<char>>((ostream *)logFile);
    sprintf(buf,"%04lx   %04lx   %04lx   %04lx",cur[0],cur[1],cur[2],cur[3]);
    Amp1394Console::Print(curLine + 2,0xf,buf);
    bVar2 = AmpIO::GetAmpTemperature(Board,index);
    bVar2 = bVar2 >> 1;
    bVar3 = AmpIO::GetAmpTemperature(Board,index_00);
    bVar3 = bVar3 >> 1;
    poVar8 = std::operator<<((ostream *)logFile,"   Motor temperatures: ");
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ushort)bVar2);
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ushort)bVar3);
    std::operator<<(poVar8," degC (expected to be increasing)");
    pcVar10 = "PASS";
    pcVar13 = "PASS";
    if (bVar3 < (ushort)local_118) {
      pcVar13 = "FAIL";
    }
    pcVar11 = " - PASS";
    if (bVar3 < (ushort)local_118) {
      pcVar11 = " - fail";
    }
    if (bVar2 < (ushort)local_114) {
      pcVar11 = " - fail";
      pcVar10 = "FAIL";
    }
    poVar8 = std::operator<<((ostream *)logFile,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar8);
    sprintf(buf,"%4d (%s)    %4d (%s)",(ulong)bVar2,pcVar10,(ulong)bVar3,pcVar13);
    Amp1394Console::Print(curLine + 4,0xf,buf);
    Amp1394Console::Refresh();
    uVar14 = ((ulong)(uVar14 < 0x8001) << 9 | 0x10000) - uVar14;
    iVar9 = 0;
    if (0x8600 < uVar14) break;
    for (; iVar9 != 4; iVar9 = iVar9 + 1) {
      AmpIO::SetMotorCurrent(Board,uVar1 + iVar9,(uint32_t)uVar14);
    }
    (*Port->_vptr_BasePort[0x21])(Port);
    Amp1394_Sleep(1.0);
    (*Port->_vptr_BasePort[0x1d])(Port);
    local_118 = (uint)bVar3;
    local_114 = (uint)bVar2;
  }
  for (; iVar9 != 4; iVar9 = iVar9 + 1) {
    AmpIO::SetMotorCurrent(Board,uVar1 + iVar9,0x8000);
  }
  (*Port->_vptr_BasePort[0x21])();
  if (uVar6 < 8) {
    AmpIO::WriteAmpEnable(Board,0xf,0);
  }
  else {
    for (iVar9 = 0; iVar9 != 4; iVar9 = iVar9 + 1) {
      AmpIO::WriteAmpEnableAxis(Board,uVar1 + iVar9,false);
    }
  }
  AmpIO::WritePowerEnable(Board,false);
  AmpIO::WriteWatchdogPeriod(Board,0xffff);
  pcVar10 = "   Overall result: FAIL";
  if (local_119 != false) {
    pcVar10 = "   Overall result: PASS";
  }
  poVar8 = std::operator<<((ostream *)logFile,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar8);
  return local_119;
}

Assistant:

bool TestPowerAmplifier(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    char buf[100];
    unsigned long status;
    unsigned long dac;
    unsigned int i;
    bool pass = true;

    // Disable watchdog
    Board.WriteWatchdogPeriod(0x0000);

    uint32_t fver = Board.GetFirmwareVersion();

    logFile << std::endl << "=== Power Amplifier Test ===" << std::endl;
    Amp1394Console::Print(curLine, 9, "Temperature sensors - ");
    Amp1394Console::Refresh();

    Board.WritePowerEnable(true);

    unsigned int motorStart = (qlaNum == 2) ? 4 : 0;

    // Enabling individual amplifiers
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0x0f);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, true);
    }
    dac = 0x8000;
    for (i = 0; i < 4; i++)
        Board.SetMotorCurrent(motorStart+i, dac);
    Port->WriteAllBoards();
    Amp1394_Sleep(1.0);  // wait for power to stabilize
    Port->ReadAllBoards();
    if (fver < 8) {
        status = Board.GetStatus();
        if ((status&0x000c0f0f) != 0x000c0f0f) {
            sprintf(buf,"Failed to enable power (%08lx) - is motor power connected?", status);
            Amp1394Console::Print(curLine++, 9, buf);
        }
    }
    else {
        for (i = 0; i < 4; i++) {
            bool motorEn = Board.GetAmpEnable(motorStart+i);
            if (!motorEn) {
                sprintf(buf,"Failed to enable power - is motor power connected?");
                Amp1394Console::Print(curLine++, 9, buf);
                break;
            }
        }
    }
    Amp1394Console::Print(curLine, 9, "Temperature sensors - ");
    // Read temperature in Celsius
    unsigned int tempStart = (qlaNum == 2) ? 2 : 0;
    unsigned short temp1 = Board.GetAmpTemperature(tempStart)/2;
    unsigned short temp2 = Board.GetAmpTemperature(tempStart+1)/2;
    logFile << "   Motor temperatures: " << std::dec << temp1 << ", " << temp2 << " degC (expected range is 20-40) ";
    if ((temp1 < 20) || (temp1 > 40) || (temp2 < 20) || (temp2 > 40)) {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "FAIL (%d, %d degC)", temp1, temp2);
    }
    else {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "PASS (%d, %d degC)", temp1, temp2);
    }
    Amp1394Console::Print(curLine++, 31, buf);

    Amp1394Console::Print(curLine, 9, "DAC:");
    Amp1394Console::Print(curLine+1, 9, "ADC:");
    Amp1394Console::Print(curLine+3, 9, "Temp:");
    Amp1394Console::Refresh();

    // Increment of 0x0200 is about 100 mA; 0x9000 is approx. 780 mA.
    unsigned long cur[4];
    while (1) {
        sprintf(buf, "%04lx   %04lx   %04lx   %04lx", dac, dac, dac, dac);
        Amp1394Console::Print(curLine, 15, buf);
        logFile << "   Commanded current: " << std::hex << dac << ", Measured currents: ";
        for (i = 0; i < 4; i++) {
            cur[i] = Board.GetMotorCurrent(motorStart+i);
            logFile << std::hex << cur[i];
            if ((cur[i] > (dac + 0x0100))
                || ((dac > 0x0100)
                    && (cur[i] < (dac - 0x0100))
                    )
                ) {
                logFile << "* ";
                Amp1394Console::Print(curLine+2, 15+7*i, "FAIL");
                pass = false;
            }
            else {
                logFile << "  ";
                Amp1394Console::Print(curLine+2, 15+7*i, "PASS");
            }
        }
        logFile << std::endl;
        sprintf(buf, "%04lx   %04lx   %04lx   %04lx", cur[0], cur[1], cur[2], cur[3]);
        Amp1394Console::Print(curLine+1, 15, buf);

        unsigned short newTemp1 = Board.GetAmpTemperature(tempStart)/2;
        unsigned short newTemp2 = Board.GetAmpTemperature(tempStart+1)/2;
        logFile << "   Motor temperatures: " << std::dec  << newTemp1 << ", " << newTemp2 << " degC (expected to be increasing)";
        if ((newTemp1 >= temp1) && (newTemp2 >= temp2))
            logFile << " - PASS" << std::endl;
        else
            logFile << " - fail" << std::endl;
        sprintf(buf, "%4d (%s)    %4d (%s)", newTemp1, ((newTemp1 >= temp1) ? "PASS" : "FAIL"),
                newTemp2, ((newTemp2 >= temp2) ? "PASS" : "FAIL"));
        Amp1394Console::Print(curLine+3, 15, buf);
        temp1 = newTemp1;
        temp2 = newTemp2;
        Amp1394Console::Refresh();

        if (dac > 0x8000) dac = 0x8000 - (dac - 0x8000);
        else dac = 0x8000 + (0x8000 - dac) + 0x0200;

        if (dac > 0x8600) break;

        for (i = 0; i < 4; i++)
            Board.SetMotorCurrent(motorStart+i, dac);
        Port->WriteAllBoards();
        Amp1394_Sleep(1.0);
        Port->ReadAllBoards();
    }

    for (i = 0; i < 4; i++)
        Board.SetMotorCurrent(motorStart+i, 0x8000);
    Port->WriteAllBoards();
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, false);
    }
    Board.WritePowerEnable(false);

    // Reenable watchdog
    Board.WriteWatchdogPeriod(0xFFFF);
    if (pass)
        logFile << "   Overall result: PASS" << std::endl;
    else
        logFile << "   Overall result: FAIL" << std::endl;
    return pass;
}